

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> * __thiscall
pstore::dump::time::writer<std::wostream>
          (time *this,basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os)

{
  size_t sVar1;
  wostream *pwVar2;
  char *pcVar3;
  char time_str [100];
  tm tm;
  time_t in_stack_ffffffffffffff48;
  tm local_50;
  
  pcVar3 = &stack0xffffffffffffff48;
  gm_time(in_stack_ffffffffffffff48);
  sVar1 = strftime(&stack0xffffffffffffff48,100,"%FT%TZ",&local_50);
  pwVar2 = os;
  if (sVar1 == 0) {
    pwVar2 = std::operator<<(os,"Time(");
    pwVar2 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar2);
    pcVar3 = "ms)";
  }
  std::operator<<(pwVar2,pcVar3);
  return os;
}

Assistant:

OStream & time::writer (OStream & os) const {
            bool fallback = true;
            std::tm const tm = gm_time (this->milliseconds_to_time ());
            char time_str[100];
            // strftime() returns 0 if the result doesn't fit in the provided buffer;
            // the contents are undefined. 100 characters should be plenty for an ISO8601 date.
            if (std::strftime (time_str, sizeof (time_str), "%FT%TZ", &tm) != 0) {
                // Guarantee that the string is null terminated.
                time_str[array_elements (time_str) - 1] = '\0';
                os << time_str;
                fallback = false;
            }

            if (fallback) {
                os << "Time(" << ms_ << "ms)";
            }
            return os;
        }